

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O0

void __thiscall
slang::FormatBuffer::
format<std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string>
          (FormatBuffer *this,
          format_string<const_std::basic_string_view<char>_&,_std::__cxx11::basic_string<char>_> fmt
          ,basic_string_view<char,_std::char_traits<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  format_args args_00;
  string_view fmt_00;
  buffer<char> *in_stack_00000048;
  locale_ref in_stack_00000050;
  locale_ref local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  value<fmt::v11::context> *in_stack_ffffffffffffff70;
  undefined8 local_70;
  undefined1 *local_68;
  undefined1 local_38 [16];
  undefined1 *local_28;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_28 = local_38;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
            (in_stack_ffffffffffffff70,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_8 = &local_70;
  local_10 = &stack0xffffffffffffff68;
  local_70 = 0xdd;
  local_68 = local_10;
  ::fmt::v11::detail::locale_ref::locale_ref(&local_a0);
  fmt_00.size_ = (size_t)fmt.str.data_;
  fmt_00.data_ = (char *)this;
  args_00.field_1.values_ = (value<fmt::v11::context> *)args;
  args_00.desc_ = (unsigned_long_long)args_1;
  ::fmt::v11::detail::vformat_to(in_stack_00000048,fmt_00,args_00,in_stack_00000050);
  return;
}

Assistant:

void format(fmt::format_string<Args...> fmt, Args&&... args) {
        fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
    }